

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O0

IShader * __thiscall
Diligent::anon_unknown_1::CompiledShaderGL::GetDeviceShader(CompiledShaderGL *this)

{
  SHADER_STATUS SVar1;
  IShader *pIVar2;
  CompiledShaderGL *this_local;
  
  pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_((RefCntAutoPtr *)&this->m_pShaderGL);
  if ((pIVar2 == (IShader *)0x0) &&
     (SVar1 = std::atomic<Diligent::SHADER_STATUS>::load(&this->m_Status,memory_order_seq_cst),
     SVar1 == SHADER_STATUS_READY)) {
    CreateGLShader(this);
  }
  pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_((RefCntAutoPtr *)&this->m_pShaderGL);
  return pIVar2;
}

Assistant:

virtual IShader* GetDeviceShader() override final
    {
        if (m_pShaderGL == nullptr)
        {
            if (m_Status.load() == SHADER_STATUS_READY)
            {
                try
                {
                    CreateGLShader();
                }
                catch (...)
                {
                    m_Status.store(SHADER_STATUS_FAILED);
                }
            }
        }
        return m_pShaderGL;
    }